

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

SegmentBuilder * __thiscall
capnp::_::BuilderArena::addSegmentInternal<capnp::word>
          (BuilderArena *this,ArrayPtr<capnp::word> content)

{
  SegmentBuilder *pSVar1;
  MultiSegmentState *this_00;
  Own<capnp::_::SegmentBuilder> newBuilder;
  SegmentWordCount contentSize;
  Own<capnp::_::SegmentBuilder> local_60;
  Own<capnp::_::BuilderArena::MultiSegmentState> local_50;
  SegmentWordCount local_40;
  Id<unsigned_int,_capnp::_::Segment> local_3c;
  ReadLimiter *local_38;
  word *local_30;
  
  if ((this->segment0).super_SegmentReader.arena != (Arena *)0x0) {
    local_40 = verifySegmentSize(content.size_);
    this_00 = (this->moreSegments).ptr.ptr;
    if (this_00 == (MultiSegmentState *)0x0) {
      kj::heap<capnp::_::BuilderArena::MultiSegmentState>();
      this_00 = (MultiSegmentState *)local_60.ptr;
      local_50.disposer = local_60.disposer;
      local_50.ptr = (MultiSegmentState *)local_60.ptr;
      local_60.ptr = (SegmentBuilder *)0x0;
      kj::Own<capnp::_::BuilderArena::MultiSegmentState>::operator=
                (&(this->moreSegments).ptr,&local_50);
      if (local_50.ptr != (MultiSegmentState *)0x0) {
        local_50.ptr = (MultiSegmentState *)0x0;
        (*(code *)**(undefined8 **)&(local_50.disposer)->field_0x0)();
      }
      if ((MultiSegmentState *)local_60.ptr != (MultiSegmentState *)0x0) {
        local_60.ptr = (SegmentBuilder *)0x0;
        (*(code *)**(undefined8 **)&(local_60.disposer)->field_0x0)();
      }
    }
    local_3c.value =
         (int)((ulong)(*(long *)&((SegmentReader *)&this_00->builders)->id -
                      (long)((SegmentReader *)&this_00->builders)->arena) >> 4) + 1;
    local_38 = &this->dummyLimiter;
    local_50.disposer = (Disposer *)this;
    local_30 = content.ptr;
    kj::
    heap<capnp::_::SegmentBuilder,capnp::_::BuilderArena*,kj::Id<unsigned_int,capnp::_::Segment>,capnp::word*,unsigned_int&,capnp::_::ReadLimiter*>
              ((kj *)&local_60,(BuilderArena **)&local_50,&local_3c,&local_30,&local_40,&local_38);
    pSVar1 = local_60.ptr;
    kj::Vector<kj::Own<capnp::_::SegmentBuilder>>::add<kj::Own<capnp::_::SegmentBuilder>>
              ((Vector<kj::Own<capnp::_::SegmentBuilder>> *)this_00,&local_60);
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::resize
              (&this_00->forOutput,
               (*(long *)&((SegmentReader *)&this_00->builders)->id -
                (long)((SegmentReader *)&this_00->builders)->arena >> 4) + 1);
    if ((MultiSegmentState *)local_60.ptr != (MultiSegmentState *)0x0) {
      local_60.ptr = (SegmentBuilder *)0x0;
      (*(code *)**(undefined8 **)&(local_60.disposer)->field_0x0)();
    }
    return (SegmentBuilder *)(MultiSegmentState *)pSVar1;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[69]>
            ((Fault *)&local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/arena.c++"
             ,0xe6,FAILED,"segment0.getArena() != nullptr",
             "\"Can\'t allocate external segments before allocating the root segment.\"",
             (char (*) [69])"Can\'t allocate external segments before allocating the root segment.")
  ;
  kj::_::Debug::Fault::fatal((Fault *)&local_60);
}

Assistant:

SegmentBuilder* BuilderArena::addSegmentInternal(kj::ArrayPtr<T> content) {
  // This check should never fail in practice, since you can't get an Orphanage without allocating
  // the root segment.
  KJ_REQUIRE(segment0.getArena() != nullptr,
      "Can't allocate external segments before allocating the root segment.");

  auto contentSize = verifySegmentSize(content.size());

  MultiSegmentState* segmentState;
  KJ_IF_MAYBE(s, moreSegments) {
    segmentState = *s;
  } else {
    auto newSegmentState = kj::heap<MultiSegmentState>();
    segmentState = newSegmentState;
    moreSegments = kj::mv(newSegmentState);
  }